

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

DayOfWeek __thiscall QLocale::firstDayOfWeek(QLocale *this)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  QLocaleData *pQVar3;
  DayOfWeek DVar4;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = ((this->d).d.ptr)->m_data;
  if (pQVar3 == &systemLocaleData) {
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_38,pQVar2,0x1d);
    ::QVariant::~QVariant((QVariant *)&local_58);
    bVar1 = ::QVariant::isNull((QVariant *)&local_38);
    if (!bVar1) {
      DVar4 = ::QVariant::toUInt((QVariant *)&local_38,(bool *)0x0);
      ::QVariant::~QVariant((QVariant *)&local_38);
      goto LAB_0030edaa;
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
    pQVar3 = ((this->d).d.ptr)->m_data;
  }
  DVar4 = *(uint *)&pQVar3->field_0x78 >> 5 & Sunday;
LAB_0030edaa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return DVar4;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DayOfWeek QLocale::firstDayOfWeek() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::FirstDayOfWeek);
        if (!res.isNull())
            return static_cast<Qt::DayOfWeek>(res.toUInt());
    }
#endif
    return static_cast<Qt::DayOfWeek>(d->m_data->m_first_day_of_week);
}